

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::csharp::GetEnumValueName
                   (string *__return_storage_ptr__,string *enum_name,string *enum_value_name)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_41;
  undefined1 local_40 [8];
  string stripped;
  string *enum_value_name_local;
  string *enum_name_local;
  string *result;
  
  stripped.field_2._8_8_ = enum_value_name;
  TryRemovePrefix((string *)local_40,enum_name,enum_value_name);
  local_41 = 0;
  ShoutyToPascalCase(__return_storage_ptr__,(string *)local_40);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  bVar1 = ascii_isdigit(*pcVar2);
  if (bVar1) {
    std::operator+(&local_78,"_",__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  local_41 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetEnumValueName(const std::string& enum_name, const std::string& enum_value_name) {
  std::string stripped = TryRemovePrefix(enum_name, enum_value_name);
  std::string result = ShoutyToPascalCase(stripped);
  // Just in case we have an enum name of FOO and a value of FOO_2... make sure the returned
  // string is a valid identifier.
  if (ascii_isdigit(result[0])) {
    result = "_" + result;
  }
  return result;
}